

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.cpp
# Opt level: O1

void __thiscall LLVMBC::MDString::MDString(MDString *this,Module *module,String *str_)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (this->super_MDOperand).parent = module;
  (this->super_MDOperand).kind = String;
  paVar1 = &(this->str).field_2;
  (this->str)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (str_->_M_dataplus)._M_p;
  paVar2 = &str_->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&str_->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->str).field_2 + 8) = uVar4;
  }
  else {
    (this->str)._M_dataplus._M_p = pcVar3;
    (this->str).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->str)._M_string_length = str_->_M_string_length;
  (str_->_M_dataplus)._M_p = (pointer)paVar2;
  str_->_M_string_length = 0;
  (str_->field_2)._M_local_buf[0] = '\0';
  return;
}

Assistant:

MDOperand::MDOperand(Module *parent_, MetadataKind kind_)
    : parent(parent_)
    , kind(kind_)
{
}